

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# halfedge.cpp
# Opt level: O2

Edges * __thiscall
graphics101::HalfEdgeTriMesh::boundary_edges(Edges *__return_storage_ptr__,HalfEdgeTriMesh *this)

{
  const_reference pvVar1;
  int hei;
  HalfEdgeIndex he_index;
  Edge de;
  
  (__return_storage_ptr__->
  super__Vector_base<glm::vec<2,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_int,_(glm::qualifier)0>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<glm::vec<2,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_int,_(glm::qualifier)0>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<glm::vec<2,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_int,_(glm::qualifier)0>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  for (he_index.value = 0;
      (ulong)he_index.value <
      (ulong)(((long)(this->m_halfedges).
                     super__Vector_base<graphics101::HalfEdgeTriMesh::HalfEdge,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdge>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->m_halfedges).
                    super__Vector_base<graphics101::HalfEdgeTriMesh::HalfEdge,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdge>_>
                    ._M_impl.super__Vector_impl_data._M_start) / 0x28);
      he_index.value = he_index.value + 1) {
    pvVar1 = std::
             vector<graphics101::HalfEdgeTriMesh::HalfEdge,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdge>_>
             ::at(&this->m_halfedges,he_index.value);
    if (pvVar1->face == -1) {
      de = he_index2directed_edge(this,he_index);
      std::
      vector<glm::vec<2,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_int,_(glm::qualifier)0>_>_>
      ::push_back(__return_storage_ptr__,&de);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

HalfEdgeTriMesh::Edges HalfEdgeTriMesh::boundary_edges() const
{
    Edges result;
    for( int hei = 0; hei < m_halfedges.size(); ++hei )
    {
        const HalfEdge& he = halfedge( HalfEdgeIndex( hei ) );

        if( -1 == he.face )
        {
            const auto de = he_index2directed_edge( HalfEdgeIndex( hei ) );
            result.push_back( de );
        }
    }

    return result;
}